

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O2

clock_t __thiscall
ymfm::fm_operator<ymfm::opn_registers_base<true>_>::clock
          (fm_operator<ymfm::opn_registers_base<true>_> *this)

{
  clock_t extraout_RAX;
  int32_t in_EDX;
  uint in_ESI;
  
  if ((this->m_regs->m_regdata[this->m_opoffs + 0x90] & 8) == 0) {
    this->m_ssg_inverted = '\0';
  }
  else {
    clock_ssg_eg_state(this);
  }
  if ((in_ESI & 3) == 0) {
    clock_envelope(this,in_ESI >> 2);
  }
  clock_phase(this,in_EDX);
  return extraout_RAX;
}

Assistant:

void fm_operator<RegisterType>::clock(uint32_t env_counter, int32_t lfo_raw_pm)
{
	// clock the SSG-EG state (OPN/OPNA)
	if (m_regs.op_ssg_eg_enable(m_opoffs))
		clock_ssg_eg_state();
	else
		m_ssg_inverted = false;

	// clock the envelope if on an envelope cycle; env_counter is a x.2 value
	if (bitfield(env_counter, 0, 2) == 0)
		clock_envelope(env_counter >> 2);

	// clock the phase
	clock_phase(lfo_raw_pm);
}